

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::writeValue(StyledWriter *this,Value *value)

{
  bool bVar1;
  ValueType VVar2;
  undefined8 this_00;
  StyledWriter *in_RSI;
  double in_RDI;
  char *in_stack_00000048;
  Value *childValue;
  string *name;
  iterator it;
  Members members;
  string *in_stack_fffffffffffffdd8;
  StyledWriter *in_stack_fffffffffffffde0;
  StyledWriter *this_01;
  Value *in_stack_fffffffffffffdf0;
  Value *in_stack_fffffffffffffdf8;
  allocator *paVar3;
  Value *in_stack_fffffffffffffe08;
  StyledWriter *in_stack_fffffffffffffe20;
  allocator<char> local_1b1;
  string local_1b0 [8];
  Value *in_stack_fffffffffffffe58;
  StyledWriter *in_stack_fffffffffffffe60;
  string local_188 [16];
  Value *in_stack_fffffffffffffe88;
  StyledWriter *in_stack_fffffffffffffe90;
  Value *root;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_158;
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [56];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [55];
  allocator local_31;
  string local_30 [24];
  Value *in_stack_ffffffffffffffe8;
  
  VVar2 = Value::type((Value *)in_RSI);
  switch(VVar2) {
  case nullValue:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"null",&local_31);
    pushValue(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  case intValue:
    Value::asLargestInt((Value *)0x12c78c);
    valueToString_abi_cxx11_((LargestInt)in_RDI);
    pushValue(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    std::__cxx11::string::~string(local_68);
    break;
  case uintValue:
    Value::asLargestUInt((Value *)0x12c7f7);
    valueToString_abi_cxx11_((LargestUInt)in_RDI);
    pushValue(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    std::__cxx11::string::~string(local_88);
    break;
  case realValue:
    Value::asDouble(in_stack_fffffffffffffe08);
    valueToString_abi_cxx11_(in_RDI);
    pushValue(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    std::__cxx11::string::~string(local_a8);
    break;
  case stringValue:
    Value::asCString(in_stack_fffffffffffffdf0);
    valueToQuotedString_abi_cxx11_(in_stack_00000048);
    pushValue(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    std::__cxx11::string::~string(local_c8);
    break;
  case booleanValue:
    Value::asBool(in_stack_fffffffffffffdf8);
    valueToString_abi_cxx11_(SUB81((ulong)local_e8 >> 0x38,0));
    pushValue(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    std::__cxx11::string::~string(local_e8);
    break;
  case arrayValue:
    writeArrayValue(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    break;
  case objectValue:
    Value::getMemberNames_abi_cxx11_(in_stack_fffffffffffffe58);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffdf0);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_120,"{}",&local_121);
      pushValue(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
    }
    else {
      paVar3 = &local_149;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"{",paVar3);
      writeWithIndent(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      indent(in_stack_fffffffffffffe20);
      local_158._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffdd8);
      while( true ) {
        this_00 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_158);
        in_stack_fffffffffffffdf0 =
             Value::operator[]((Value *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        root = in_stack_fffffffffffffdf0;
        writeCommentBeforeValue(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        std::__cxx11::string::c_str();
        valueToQuotedString_abi_cxx11_(in_stack_00000048);
        writeWithIndent(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        std::__cxx11::string::~string(local_188);
        std::__cxx11::string::operator+=((string *)((long)in_RDI + 0x20)," : ");
        writeValue(in_RSI,in_stack_ffffffffffffffe8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_158);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffdd8);
        bVar1 = __gnu_cxx::operator==
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffde0,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffdd8);
        if (bVar1) break;
        std::__cxx11::string::operator+=((string *)((long)in_RDI + 0x20),",");
        writeCommentAfterValueOnSameLine((StyledWriter *)this_00,root);
      }
      writeCommentAfterValueOnSameLine((StyledWriter *)this_00,root);
      unindent(in_stack_fffffffffffffde0);
      this_01 = (StyledWriter *)&local_1b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b0,"}",(allocator *)this_01);
      writeWithIndent(this_01,in_stack_fffffffffffffdd8);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator(&local_1b1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffdf0);
  }
  return;
}

Assistant:

void StyledWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    pushValue("null");
    break;
  case intValue:
    pushValue(valueToString(value.asLargestInt()));
    break;
  case uintValue:
    pushValue(valueToString(value.asLargestUInt()));
    break;
  case realValue:
    pushValue(valueToString(value.asDouble()));
    break;
  case stringValue:
    pushValue(valueToQuotedString(value.asCString()));
    break;
  case booleanValue:
    pushValue(valueToString(value.asBool()));
    break;
  case arrayValue:
    writeArrayValue(value);
    break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    if (members.empty())
      pushValue("{}");
    else {
      writeWithIndent("{");
      indent();
      Value::Members::iterator it = members.begin();
      for (;;) {
        const std::string& name = *it;
        const Value& childValue = value[name];
        writeCommentBeforeValue(childValue);
        writeWithIndent(valueToQuotedString(name.c_str()));
        document_ += " : ";
        writeValue(childValue);
        if (++it == members.end()) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        document_ += ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("}");
    }
  } break;
  }
}